

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

LibraryIncDirClauseSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LibraryIncDirClauseSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax>const&>
          (BumpAllocator *this,Token *args,Token *args_1,
          SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *args_2)

{
  Token incdir;
  LibraryIncDirClauseSyntax *pLVar1;
  SeparatedSyntaxList<slang::syntax::FilePathSpecSyntax> *in_RDX;
  LibraryIncDirClauseSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  Token in_stack_00000008;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pLVar1 = (LibraryIncDirClauseSyntax *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  incdir.info = unaff_retaddr;
  incdir.kind = (short)in_RDI;
  incdir._2_1_ = (char)((ulong)in_RDI >> 0x10);
  incdir.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  incdir.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::LibraryIncDirClauseSyntax::LibraryIncDirClauseSyntax
            (in_RSI,in_stack_00000008,incdir,in_RDX);
  return pLVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }